

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  GLFWbool GVar1;
  _func_void__GLFWwindow_ptr_int *UNRECOVERED_JUMPTABLE;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  int code;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x209,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    code = 0x10001;
    pcVar4 = (char *)0x0;
LAB_00110825:
    _glfwInputError(code,pcVar4);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  switch(mode) {
  case 0x33001:
    if (value - 0x34004U < 0xfffffffd) {
      pcVar4 = "Invalid cursor mode 0x%08X";
      uVar3 = (ulong)(uint)value;
      goto LAB_00110a11;
    }
    if (*(int *)(handle + 0x84) != value) {
      *(int *)(handle + 0x84) = value;
      (*_glfw.platform.getCursorPos)
                ((_GLFWwindow *)handle,(double *)(handle + 0x1f0),(double *)(handle + 0x1f8));
      UNRECOVERED_JUMPTABLE = _glfw.platform.setCursorMode;
LAB_00110a63:
      (*UNRECOVERED_JUMPTABLE)((_GLFWwindow *)handle,value);
      return;
    }
    break;
  case 0x33002:
    if (*(uint *)(handle + 0x78) != (uint)(value != 0)) {
      if (value == 0) {
        lVar2 = 0x90;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1ed);
      }
      *(uint *)(handle + 0x78) = (uint)(value != 0);
    }
    break;
  case 0x33003:
    if (*(uint *)(handle + 0x7c) != (uint)(value != 0)) {
      if (value == 0) {
        uVar3 = *(ulong *)(handle + 0x88);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar3;
        if ((char)uVar3 == '\x03') {
          handle[0x88] = (GLFWwindow)0x0;
        }
        auVar6[1] = -((char)uVar3 == '\0');
        auVar6[0] = 0xff;
        auVar6[2] = -((char)(uVar3 >> 8) == '\x03');
        auVar6[3] = -((char)(uVar3 >> 0x10) == '\x03');
        auVar6[4] = 0xff;
        cVar7 = (char)(uVar3 >> 0x20);
        auVar6[5] = -(cVar7 == '\0');
        auVar6[6] = -((char)(uVar3 >> 0x28) == '\0');
        auVar6[7] = -((char)(uVar3 >> 0x30) == '\0');
        auVar6[8] = 0xff;
        auVar6[9] = 0xff;
        auVar6[10] = 0xff;
        auVar6[0xb] = 0xff;
        auVar6[0xc] = 0xff;
        auVar6[0xd] = 0xff;
        auVar6[0xe] = 0xff;
        auVar6[0xf] = 0xff;
        if ((auVar6[2] & 1) != 0) {
          handle[0x89] = (GLFWwindow)0x0;
        }
        auVar5 = pshuflw(auVar6,auVar5,0x55);
        if (auVar5[4] == '\x03') {
          handle[0x8a] = (GLFWwindow)0x0;
        }
        if ((char)(uVar3 >> 0x18) == '\x03') {
          handle[0x8b] = (GLFWwindow)0x0;
        }
        if (cVar7 == '\0') {
          handle[0x8c] = (GLFWwindow)0x0;
        }
        handle[0x8d] = (GLFWwindow)0x0;
        handle[0x8e] = (GLFWwindow)0x0;
        handle[0x8f] = (GLFWwindow)0x0;
      }
      *(uint *)(handle + 0x7c) = (uint)(value != 0);
    }
    break;
  case 0x33004:
    *(uint *)(handle + 0x80) = (uint)(value != 0);
    break;
  case 0x33005:
    GVar1 = (*_glfw.platform.rawMouseMotionSupported)();
    if (GVar1 == 0) {
      pcVar4 = "Raw mouse motion is not supported on this system";
      code = 0x10008;
      goto LAB_00110825;
    }
    value = (int)(value != 0);
    if (*(uint *)(handle + 0x200) != value) {
      *(int *)(handle + 0x200) = value;
      UNRECOVERED_JUMPTABLE = (_func_void__GLFWwindow_ptr_int *)_glfw.platform.setRawMouseMotion;
      goto LAB_00110a63;
    }
    break;
  default:
    pcVar4 = "Invalid input mode 0x%08X";
LAB_00110a11:
    _glfwInputError(0x10003,pcVar4,uVar3);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode 0x%08X",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfw.platform.getCursorPos(window,
                                        &window->virtualCursorPosX,
                                        &window->virtualCursorPosY);
            _glfw.platform.setCursorMode(window, value);
            return;
        }

        case GLFW_STICKY_KEYS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value;
            return;
        }

        case GLFW_LOCK_KEY_MODS:
        {
            window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_RAW_MOUSE_MOTION:
        {
            if (!_glfw.platform.rawMouseMotionSupported())
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Raw mouse motion is not supported on this system");
                return;
            }

            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->rawMouseMotion == value)
                return;

            window->rawMouseMotion = value;
            _glfw.platform.setRawMouseMotion(window, value);
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}